

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_link_destination_B
              (MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET max_end,MD_OFFSET *p_end,
              MD_OFFSET *p_contents_beg,MD_OFFSET *p_contents_end)

{
  int parenthesis_level;
  MD_OFFSET off;
  MD_OFFSET *p_contents_end_local;
  MD_OFFSET *p_contents_beg_local;
  MD_OFFSET *p_end_local;
  MD_OFFSET max_end_local;
  MD_OFFSET beg_local;
  MD_CTX *ctx_local;
  int local_4;
  
  parenthesis_level = 0;
  off = beg;
  while (off < max_end) {
    if (((ctx->text[off] == '\\') && (off + 1 < max_end)) &&
       (((((0x20 < (byte)ctx->text[off + 1] && ((byte)ctx->text[off + 1] < 0x30)) ||
          ((0x39 < (byte)ctx->text[off + 1] && ((byte)ctx->text[off + 1] < 0x41)))) ||
         ((0x5a < (byte)ctx->text[off + 1] && ((byte)ctx->text[off + 1] < 0x61)))) ||
        ((0x7a < (byte)ctx->text[off + 1] && ((byte)ctx->text[off + 1] < 0x7f)))))) {
      off = off + 2;
    }
    else {
      if ((ctx->text[off] == ' ') ||
         ((((ctx->text[off] == '\t' || (ctx->text[off] == '\v')) || (ctx->text[off] == '\f')) ||
          (((byte)ctx->text[off] < 0x20 || (ctx->text[off] == '\x7f')))))) break;
      if (ctx->text[off] == '(') {
        parenthesis_level = parenthesis_level + 1;
        if (0x20 < parenthesis_level) {
          return 0;
        }
      }
      else if (ctx->text[off] == ')') {
        if (parenthesis_level == 0) break;
        parenthesis_level = parenthesis_level + -1;
      }
      off = off + 1;
    }
  }
  if ((parenthesis_level == 0) && (off != beg)) {
    *p_contents_beg = beg;
    *p_contents_end = off;
    *p_end = off;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
md_is_link_destination_B(MD_CTX* ctx, OFF beg, OFF max_end, OFF* p_end,
                         OFF* p_contents_beg, OFF* p_contents_end)
{
    OFF off = beg;
    int parenthesis_level = 0;

    while(off < max_end) {
        if(CH(off) == _T('\\')  &&  off+1 < max_end  &&  ISPUNCT(off+1)) {
            off += 2;
            continue;
        }

        if(ISWHITESPACE(off) || ISCNTRL(off))
            break;

        /* Link destination may include balanced pairs of unescaped '(' ')'.
         * Note we limit the maximal nesting level by 32 to protect us from
         * https://github.com/jgm/cmark/issues/214 */
        if(CH(off) == _T('(')) {
            parenthesis_level++;
            if(parenthesis_level > 32)
                return FALSE;
        } else if(CH(off) == _T(')')) {
            if(parenthesis_level == 0)
                break;
            parenthesis_level--;
        }

        off++;
    }

    if(parenthesis_level != 0  ||  off == beg)
        return FALSE;

    /* Success. */
    *p_contents_beg = beg;
    *p_contents_end = off;
    *p_end = off;
    return TRUE;
}